

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

Cnf_Dat_t * Acb_NtkWindow2Cnf(Acb_Ntk_t *p,Vec_Int_t *vWinObjs,int Pivot)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *p_01;
  Vec_Int_t *vLits;
  Cnf_Dat_t *pCVar8;
  int **ppiVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  char *__assertion;
  long lVar20;
  long local_80;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_00->pArray = piVar6;
  if (Pivot < 0) {
LAB_00379d08:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_80 = 0xffffffff;
  lVar13 = local_80;
  if (0 < (long)vWinObjs->nSize) {
    lVar12 = 0;
    do {
      lVar13 = lVar12;
      if (vWinObjs->pArray[lVar12] == Pivot * 2) break;
      lVar12 = lVar12 + 1;
      lVar13 = local_80;
    } while (vWinObjs->nSize != lVar12);
  }
  local_80 = lVar13;
  iVar19 = (int)local_80;
  iVar4 = Acb_NtkCountRoots(vWinObjs,iVar19);
  iVar11 = vWinObjs->nSize;
  pVVar7 = Acb_DeriveCnfForWindow(p,vWinObjs,iVar19);
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_01->pArray = piVar6;
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 1000;
  vLits->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vLits->pArray = piVar6;
  if (0 < vWinObjs->nSize) {
    piVar6 = vWinObjs->pArray;
    lVar13 = 0;
    do {
      uVar15 = piVar6[lVar13];
      if ((int)uVar15 < 0) goto LAB_00379d65;
      if (uVar15 < 2) goto LAB_00379ce9;
      uVar17 = (p->vObjFunc).nSize;
      if ((int)uVar17 < 1) goto LAB_00379ce0;
      uVar15 = uVar15 >> 1;
      if (uVar17 <= uVar15) goto LAB_00379cc1;
      piVar3 = (p->vObjFunc).pArray;
      if (piVar3[uVar15] != -1) {
        __assert_fail("Acb_ObjFunc(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x11b,"void Acb_ObjSetFunc(Acb_Ntk_t *, int, int)");
      }
      piVar3[uVar15] = (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (lVar13 < vWinObjs->nSize);
  }
  Vec_IntPush(p_01,0);
  iVar5 = vWinObjs->nSize;
  if (0 < iVar5) {
    lVar13 = 0;
    do {
      uVar15 = vWinObjs->pArray[lVar13];
      if ((int)uVar15 < 0) goto LAB_00379d46;
      if ((iVar19 <= lVar13) || ((uVar15 & 1) == 0)) {
        if (uVar15 < 2) goto LAB_00379da3;
        uVar15 = uVar15 >> 1;
        if ((p->vObjType).nSize <= (int)uVar15) goto LAB_00379d84;
        if (0xfd < (byte)((p->vObjType).pArray[uVar15] - 5U)) {
          __assert_fail("!Acb_ObjIsCio(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                        ,0xd5,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
        }
        p_00->nSize = 0;
        if ((p->vObjFans).nSize <= (int)uVar15) goto LAB_00379cc1;
        iVar5 = (p->vObjFans).pArray[uVar15];
        lVar12 = (long)iVar5;
        if ((lVar12 < 0) || ((p->vFanSto).nSize <= iVar5)) goto LAB_00379d27;
        piVar6 = (p->vFanSto).pArray;
        if (0 < piVar6[lVar12]) {
          lVar20 = 0;
          do {
            uVar17 = piVar6[lVar12 + lVar20 + 1];
            if ((long)(int)uVar17 < 1) goto LAB_00379ce9;
            uVar1 = (p->vObjFunc).nSize;
            if ((int)uVar1 < 1) goto LAB_00379ce0;
            if (uVar1 <= uVar17) goto LAB_00379cc1;
            lVar20 = lVar20 + 1;
            Vec_IntPush(p_00,(p->vObjFunc).pArray[(int)uVar17]);
          } while (lVar20 < piVar6[lVar12]);
        }
        uVar17 = (p->vObjFunc).nSize;
        if ((int)uVar17 < 1) goto LAB_00379ce0;
        if (uVar17 <= uVar15) goto LAB_00379cc1;
        Vec_IntPush(p_00,(p->vObjFunc).pArray[uVar15]);
        if (pVVar7->nSize <= (int)uVar15) goto LAB_00379dc2;
        Acb_TranslateCnf(p_01,vLits,(Vec_Str_t *)(pVVar7->pArray + uVar15),p_00,-1);
        iVar5 = vWinObjs->nSize;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar5);
  }
  uVar15 = iVar19 + 1;
  iVar10 = iVar11 - uVar15;
  uVar16 = (ulong)uVar15;
  uVar14 = uVar16;
  if ((int)uVar15 < iVar5) {
    do {
      uVar17 = vWinObjs->pArray[uVar14];
      if ((int)uVar17 < 0) {
LAB_00379d65:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar17 < 2) {
LAB_00379da3:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      uVar17 = uVar17 >> 1;
      if ((p->vObjType).nSize <= (int)uVar17) {
LAB_00379d84:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[uVar17] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0xe2,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
      }
      p_00->nSize = 0;
      if ((p->vObjFans).nSize <= (int)uVar17) goto LAB_00379cc1;
      iVar5 = (p->vObjFans).pArray[uVar17];
      lVar13 = (long)iVar5;
      if ((lVar13 < 0) || ((p->vFanSto).nSize <= iVar5)) {
LAB_00379d27:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar6 = (p->vFanSto).pArray;
      if (0 < piVar6[lVar13]) {
        lVar12 = 0;
        do {
          uVar1 = piVar6[lVar13 + lVar12 + 1];
          if ((long)(int)uVar1 < 1) goto LAB_00379ce9;
          uVar2 = (p->vObjFunc).nSize;
          if ((int)uVar2 < 1) goto LAB_00379ce0;
          if (uVar2 <= uVar1) goto LAB_00379cc1;
          lVar12 = lVar12 + 1;
          iVar5 = (p->vObjFunc).pArray[(int)uVar1];
          iVar18 = 0;
          if (iVar19 < iVar5) {
            iVar18 = iVar10;
          }
          Vec_IntPush(p_00,iVar18 + iVar5);
        } while (lVar12 < piVar6[lVar13]);
      }
      uVar1 = (p->vObjFunc).nSize;
      if ((int)uVar1 < 1) goto LAB_00379ce0;
      if (uVar1 <= uVar17) goto LAB_00379cc1;
      Vec_IntPush(p_00,(p->vObjFunc).pArray[uVar17] + iVar10);
      if (pVVar7->nSize <= (int)uVar17) {
LAB_00379dc2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Acb_TranslateCnf(p_01,vLits,(Vec_Str_t *)(pVVar7->pArray + uVar17),p_00,iVar19);
      uVar14 = uVar14 + 1;
      iVar5 = vWinObjs->nSize;
    } while ((int)uVar14 < iVar5);
  }
  iVar11 = iVar11 + iVar4 + iVar10;
  if (0 < iVar4) {
    p_00->nSize = 0;
    if (iVar5 <= (int)uVar15) {
      Vec_IntPush(p_01,vLits->nSize);
LAB_00379e4b:
      __assert_fail("nRoots == Vec_IntSize(vFaninVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x102,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
    iVar19 = iVar5 + iVar10;
    do {
      uVar15 = vWinObjs->pArray[uVar16];
      if ((int)uVar15 < 0) {
LAB_00379d46:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((uVar15 & 1) != 0) {
        if (uVar15 < 2) goto LAB_00379ce9;
        uVar17 = (p->vObjFunc).nSize;
        if ((int)uVar17 < 1) goto LAB_00379ce0;
        uVar15 = uVar15 >> 1;
        if (uVar17 <= uVar15) {
LAB_00379cc1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (p->vObjFunc).pArray[uVar15];
        if (((iVar5 < 0) || (iVar5 + iVar10 < 0)) || (iVar19 < 0)) goto LAB_00379d08;
        uVar1 = iVar19 * 2;
        Vec_IntPush(vLits,iVar5 * 2 + 1);
        Vec_IntPush(vLits,(iVar5 + iVar10) * 2);
        Vec_IntPush(vLits,uVar1);
        Vec_IntPush(p_01,vLits->nSize);
        uVar17 = (p->vObjFunc).nSize;
        if ((int)uVar17 < 1) goto LAB_00379ce0;
        if (uVar17 <= uVar15) goto LAB_00379cc1;
        iVar5 = (p->vObjFunc).pArray[uVar15];
        if ((iVar5 < 0) || (iVar5 + iVar10 < 0)) goto LAB_00379d08;
        Vec_IntPush(vLits,iVar5 * 2);
        Vec_IntPush(vLits,(iVar5 + iVar10) * 2 + 1);
        Vec_IntPush(vLits,uVar1);
        Vec_IntPush(p_01,vLits->nSize);
        uVar17 = (p->vObjFunc).nSize;
        if ((int)uVar17 < 1) goto LAB_00379ce0;
        if (uVar17 <= uVar15) goto LAB_00379cc1;
        iVar5 = (p->vObjFunc).pArray[uVar15];
        if ((iVar5 < 0) || (iVar5 + iVar10 < 0)) goto LAB_00379d08;
        Vec_IntPush(vLits,iVar5 * 2);
        Vec_IntPush(vLits,(iVar5 + iVar10) * 2);
        Vec_IntPush(vLits,uVar1 | 1);
        Vec_IntPush(p_01,vLits->nSize);
        uVar17 = (p->vObjFunc).nSize;
        if ((int)uVar17 < 1) goto LAB_00379ce0;
        if (uVar17 <= uVar15) goto LAB_00379cc1;
        iVar5 = (p->vObjFunc).pArray[uVar15];
        if ((iVar5 < 0) || (iVar5 + iVar10 < 0)) goto LAB_00379d08;
        Vec_IntPush(vLits,iVar5 * 2 + 1);
        Vec_IntPush(vLits,(iVar5 + iVar10) * 2 + 1);
        Vec_IntPush(vLits,uVar1 | 1);
        Vec_IntPush(p_01,vLits->nSize);
        iVar19 = iVar19 + 1;
        Vec_IntPush(p_00,uVar1);
        iVar5 = vWinObjs->nSize;
      }
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < iVar5);
    iVar5 = p_00->nSize;
    if (0 < (long)iVar5) {
      piVar6 = p_00->pArray;
      lVar13 = 0;
      do {
        Vec_IntPush(vLits,piVar6[lVar13]);
        lVar13 = lVar13 + 1;
      } while (iVar5 != lVar13);
    }
    Vec_IntPush(p_01,vLits->nSize);
    if (iVar4 != iVar5) goto LAB_00379e4b;
    if (iVar19 != iVar11) {
      __assert_fail("nVars == nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x103,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pCVar8 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar8->nVars = iVar11;
  lVar13 = (long)p_01->nSize;
  pCVar8->nClauses = p_01->nSize + -1;
  pCVar8->nLiterals = vLits->nSize;
  ppiVar9 = (int **)malloc(lVar13 * 8);
  pCVar8->pClauses = ppiVar9;
  *ppiVar9 = vLits->pArray;
  piVar6 = p_01->pArray;
  if (lVar13 < 1) {
    if (piVar6 == (int *)0x0) goto LAB_00379c9f;
  }
  else {
    lVar12 = 0;
    do {
      ppiVar9[lVar12] = *ppiVar9 + piVar6[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar13 != lVar12);
  }
  free(piVar6);
LAB_00379c9f:
  free(p_01);
  free(vLits);
  return pCVar8;
LAB_00379ce9:
  __assertion = "i>0";
  goto LAB_00379cf0;
LAB_00379ce0:
  __assertion = "Acb_NtkHasObjFuncs(p)";
LAB_00379cf0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
}

Assistant:

Cnf_Dat_t * Acb_NtkWindow2Cnf( Acb_Ntk_t * p, Vec_Int_t * vWinObjs, int Pivot )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vFaninVars = Vec_IntAlloc( 8 );
    int PivotVar = Vec_IntFind(vWinObjs, Abc_Var2Lit(Pivot, 0));
    int nRoots   = Acb_NtkCountRoots(vWinObjs, PivotVar);
    int TfoStart = PivotVar + 1;
    int nTfoSize = Vec_IntSize(vWinObjs) - TfoStart;
    int nVarsAll = Vec_IntSize(vWinObjs) + nTfoSize + nRoots;
    int i, k, iObj, iObjLit, iFanin, * pFanins, Entry;
    Vec_Wec_t * vCnfs = Acb_DeriveCnfForWindow( p, vWinObjs, PivotVar );
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 1000 );
    // mark new SAT variables
    Vec_IntForEachEntry( vWinObjs, iObj, i )
        Acb_ObjSetFunc( p, Abc_Lit2Var(iObj), i );
    // add clauses for all nodes
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntForEachEntry( vWinObjs, iObjLit, i )
    {
        if ( Abc_LitIsCompl(iObjLit) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
    {
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) + (Acb_ObjFunc(p, iFanin) > PivotVar) * nTfoSize );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) + nTfoSize );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, PivotVar );
    }
    if ( nRoots > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + nTfoSize;
        Vec_IntClear( vFaninVars );
        Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
        {
            if ( !Abc_LitIsCompl(iObjLit) )
                continue;
            iObj = Abc_Lit2Var(iObjLit);
            // add clauses
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars++, 0) );
        }
        Vec_IntAppend( vLits, vFaninVars );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        assert( nRoots == Vec_IntSize(vFaninVars) );
        assert( nVars == nVarsAll );
    }
    Vec_IntFree( vFaninVars );
    // create CNF structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVarsAll;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    // cleanup
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
    //Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}